

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_function_queue.h
# Opt level: O0

bool __thiscall
density::
sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
::try_reentrant_consume_impl_cached
          (sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
           *this,reentrant_consume_operation *param_2)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *this_00;
  void *i_dest;
  reentrant_consume_operation *i_consume_local;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *this_local;
  
  bVar1 = sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
          ::try_start_reentrant_consume(&this->m_queue,param_2);
  if (bVar1) {
    this_00 = sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              ::reentrant_consume_operation::complete_type(param_2);
    i_dest = sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
             ::reentrant_consume_operation::unaligned_element_ptr(param_2);
    detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>::align_invoke_destroy
              (this_00,i_dest);
    sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_consume_operation::commit_nodestroy(param_2);
  }
  return bVar1;
}

Assistant:

bool try_reentrant_consume_impl_cached(
          std::true_type, reentrant_consume_operation & i_consume, PARAMS... i_params)
        {
            if (m_queue.try_start_reentrant_consume(i_consume))
            {
                i_consume.complete_type().align_invoke_destroy(
                  i_consume.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                i_consume.commit_nodestroy();
                return true;
            }
            else
            {
                return false;
            }
        }